

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O2

reference __thiscall
andres::View<unsigned_char,false,std::allocator<unsigned_long>>::operator()
          (View<unsigned_char,false,std::allocator<unsigned_long>> *this,size_t value,
          unsigned_long args)

{
  long lVar1;
  size_t sVar2;
  size_t sVar3;
  bool assertion;
  
  View<unsigned_char,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<unsigned_char,_false,_std::allocator<unsigned_long>_> *)this);
  if (*(long *)this == 0) {
    assertion = false;
  }
  else {
    sVar2 = View<unsigned_char,_false,_std::allocator<unsigned_long>_>::dimension
                      ((View<unsigned_char,_false,_std::allocator<unsigned_long>_> *)this);
    assertion = sVar2 == 2;
  }
  marray_detail::Assert<bool>(assertion);
  lVar1 = *(long *)this;
  sVar2 = View<unsigned_char,_false,_std::allocator<unsigned_long>_>::strides
                    ((View<unsigned_char,_false,_std::allocator<unsigned_long>_> *)this,0);
  sVar3 = View<unsigned_char,_false,_std::allocator<unsigned_long>_>::elementAccessHelper
                    ((View<unsigned_char,_false,_std::allocator<unsigned_long>_> *)this,2,args);
  return (reference)(sVar3 + sVar2 * value + lVar1);
}

Assistant:

inline typename View<T, isConst, A>::reference
View<T, isConst, A>::operator()
(
    const std::size_t value, 
    const Args... args
) const
{
    testInvariant();
    marray_detail::Assert( MARRAY_NO_DEBUG || ( data_ != 0 && sizeof...(args)+1 == dimension() ) );
    return data_[ strides(0) * static_cast<std::size_t>(value) 
        + static_cast<std::size_t>(elementAccessHelper(sizeof...(args)+1, args...)) ];
}